

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall asl::Array<wchar_t>::dup(Array<wchar_t> *this,int __fd)

{
  wchar_t *pwVar1;
  wchar_t *in_RAX;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  Array<wchar_t> local_18;
  
  if (this->_a[-2] != L'\x01') {
    local_18._a = in_RAX;
    clone(&local_18,(__fn *)this,in_RDX,in_ECX,in_R8);
    if (this->_a != local_18._a) {
      LOCK();
      pwVar1 = this->_a + -2;
      *pwVar1 = *pwVar1 + L'\xffffffff';
      UNLOCK();
      if (*pwVar1 == L'\0') {
        free(this->_a + -4);
      }
      this->_a = (wchar_t *)local_18;
      LOCK();
      local_18._a[-2] = local_18._a[-2] + L'\x01';
      UNLOCK();
    }
    LOCK();
    pwVar1 = local_18._a + -2;
    *pwVar1 = *pwVar1 + L'\xffffffff';
    UNLOCK();
    if (*pwVar1 == L'\0') {
      free(local_18._a + -4);
    }
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}